

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O0

void hash_print_usage(char *executable)

{
  undefined8 in_RDI;
  hash_params default_params;
  hash_params *in_stack_ffffffffffffffa0;
  
  hash_params::hash_params(in_stack_ffffffffffffffa0);
  printf("\n");
  printf("usage: %s [options] GGUF_IN\n",in_RDI);
  printf("\n");
  printf("Hash a GGUF file");
  printf("\n");
  printf("options:\n");
  printf("  -h, --help              show this help message and exit\n");
  printf("      --xxh64             use xxh64 hash\n");
  printf("      --sha1              use sha1 hash\n");
  printf("      --sha256            use sha256 hash\n");
  printf("      --all               use all hash\n");
  printf("      --no-layer          exclude per layer hash\n");
  printf("      --uuid              generate UUIDv5 ID\n");
  printf("  -c, --check <manifest>  verify against a manifest\n");
  printf("\n");
  hash_params::~hash_params(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

static void hash_print_usage(const char * executable) {
    const hash_params default_params;
    printf("\n");
    printf("usage: %s [options] GGUF_IN\n", executable);
    printf("\n");
    printf("Hash a GGUF file");
    printf("\n");
    printf("options:\n");
    printf("  -h, --help              show this help message and exit\n");
    printf("      --xxh64             use xxh64 hash\n");
    printf("      --sha1              use sha1 hash\n");
    printf("      --sha256            use sha256 hash\n");
    printf("      --all               use all hash\n");
    printf("      --no-layer          exclude per layer hash\n");
    printf("      --uuid              generate UUIDv5 ID\n");
    printf("  -c, --check <manifest>  verify against a manifest\n");
    printf("\n");
}